

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

void __thiscall ipx::Basis::ConstructBasisFromWeights(Basis *this,double *colscale,Info *info)

{
  ipxint iVar1;
  ostream *poVar2;
  long in_RDX;
  Basis *in_RDI;
  char (*in_stack_00000068) [48];
  double sigma;
  Info *in_stack_000002d0;
  double *in_stack_000002d8;
  Basis *in_stack_000002e0;
  Info *in_stack_00000370;
  double *in_stack_00000378;
  Basis *in_stack_00000380;
  double in_stack_fffffffffffffec8;
  Basis *in_stack_fffffffffffffef0;
  Control *this_00;
  string local_d8 [32];
  string *in_stack_ffffffffffffff48;
  Control *in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90 [8];
  Info *in_stack_ffffffffffffff78;
  Basis *in_stack_ffffffffffffff80;
  string local_70 [24];
  double *in_stack_ffffffffffffffa8;
  Basis *in_stack_ffffffffffffffb0;
  string local_40 [32];
  double local_20;
  long local_18;
  
  *(undefined4 *)(in_RDX + 0xc) = 0;
  *(undefined4 *)(in_RDX + 0x38) = 0;
  *(undefined4 *)(in_RDX + 0x3c) = 0;
  local_18 = in_RDX;
  iVar1 = Control::crash_basis(in_RDI->control_);
  if (iVar1 == 0) {
    SetToSlackBasis(in_stack_fffffffffffffef0);
  }
  else {
    CrashBasis(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_20 = MinSingularValue(in_RDI);
    poVar2 = Control::Debug(in_RDI->control_,1);
    Textline<char[39]>((char (*) [39])in_stack_00000068);
    poVar2 = std::operator<<(poVar2,local_40);
    sci2_abi_cxx11_(in_stack_fffffffffffffec8);
    poVar2 = std::operator<<(poVar2,local_70);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_40);
    Repair(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (*(int *)(local_18 + 0xcc) < 0) {
      this_00 = in_RDI->control_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90," discarding crash basis\n",&local_91);
      Control::hLog(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      SetToSlackBasis((Basis *)this_00);
    }
    else if (0 < *(int *)(local_18 + 0xcc)) {
      local_20 = MinSingularValue(in_RDI);
      poVar2 = Control::Debug(in_RDI->control_,1);
      Textline<char[48]>(in_stack_00000068);
      poVar2 = std::operator<<(poVar2,(string *)&stack0xffffffffffffff48);
      sci2_abi_cxx11_(in_stack_fffffffffffffec8);
      poVar2 = std::operator<<(poVar2,local_d8);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    }
  }
  PivotFreeVariablesIntoBasis(in_stack_000002e0,in_stack_000002d8,in_stack_000002d0);
  if (*(int *)(local_18 + 0xc) == 0) {
    PivotFixedVariablesOutOfBasis(in_stack_00000380,in_stack_00000378,in_stack_00000370);
  }
  return;
}

Assistant:

void Basis::ConstructBasisFromWeights(const double* colscale, Info* info) {
    assert(colscale);
    info->errflag = 0;
    info->dependent_rows = 0;
    info->dependent_cols = 0;

    if (control_.crash_basis()) {
        CrashBasis(colscale);
        double sigma = MinSingularValue();
        control_.Debug()
            << Textline("Minimum singular value of crash basis:") << sci2(sigma)
            << '\n';
        Repair(info);
        if (info->basis_repairs < 0) {
	  control_.hLog(" discarding crash basis\n");
            SetToSlackBasis();
        }
        else if (info->basis_repairs > 0) {
            sigma = MinSingularValue();
            control_.Debug()
                << Textline("Minimum singular value of repaired crash basis:")
                << sci2(sigma) << '\n';
        }
    } else {
        SetToSlackBasis();
    }
    PivotFreeVariablesIntoBasis(colscale, info);
    if (info->errflag)
        return;
    PivotFixedVariablesOutOfBasis(colscale, info);
    if (info->errflag)
        return;
}